

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O3

void wabt::RenameAll(Module *module)

{
  pointer ppFVar1;
  pointer ppGVar2;
  pointer ppTVar3;
  pointer ppEVar4;
  pointer ppEVar5;
  pointer ppTVar6;
  pointer ppMVar7;
  pointer ppDVar8;
  pointer ppEVar9;
  Index IVar10;
  pointer ppFVar11;
  pointer ppEVar12;
  long lVar13;
  _Rb_tree_header *__position;
  pointer ppGVar14;
  pointer ppTVar15;
  pointer ppEVar16;
  pointer ppEVar17;
  pointer ppTVar18;
  pointer ppMVar19;
  pointer ppDVar20;
  _Alloc_node __an;
  set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_> filter;
  string_view local_158;
  char *local_148;
  undefined8 local_140;
  char *local_138;
  undefined8 local_130;
  char *local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 local_110;
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  _Alloc_node local_68;
  _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
  local_60;
  
  local_158.data_ = "const";
  local_158.size_ = 5;
  local_148 = "std";
  local_140 = 3;
  local_138 = "allocator";
  local_130 = 9;
  local_128 = "char";
  local_120 = 4;
  local_118 = "basic";
  local_110 = 5;
  local_108 = "traits";
  local_100 = 6;
  local_f8 = "wchar";
  local_f0 = 5;
  local_e8 = "t";
  local_e0 = 1;
  local_d8 = "void";
  local_d0 = 4;
  local_c8 = "int";
  local_c0 = 3;
  local_b8 = "unsigned";
  local_b0 = 8;
  local_a8 = "2";
  local_a0 = 1;
  local_98 = "cxxabiv1";
  local_90 = 8;
  local_88 = "short";
  local_80 = 5;
  local_78 = "4096ul";
  local_70 = 6;
  __position = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar13 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_t = &local_60;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    std::
    _Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>
    ::
    _M_insert_unique_<wabt::string_view_const&,std::_Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>::_Alloc_node>
              ((_Rb_tree<wabt::string_view,wabt::string_view,std::_Identity<wabt::string_view>,std::less<wabt::string_view>,std::allocator<wabt::string_view>>
                *)&local_60,(const_iterator)__position,
               (string_view *)((long)&local_158.data_ + lVar13),&local_68);
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xf0);
  ppFVar11 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar11 != ppFVar1) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppFVar11)->name,IVar10,&module->func_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)&local_60);
      ppFVar11 = ppFVar11 + 1;
      IVar10 = IVar10 + 1;
    } while (ppFVar11 != ppFVar1);
  }
  ppGVar14 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar14 != ppGVar2) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppGVar14)->name,IVar10,&module->global_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppGVar14 = ppGVar14 + 1;
      IVar10 = IVar10 + 1;
    } while (ppGVar14 != ppGVar2);
  }
  ppTVar15 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar15 != ppTVar3) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppTVar15)->name,IVar10,&module->table_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppTVar15 = ppTVar15 + 1;
      IVar10 = IVar10 + 1;
    } while (ppTVar15 != ppTVar3);
  }
  ppEVar16 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar16 != ppEVar4) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppEVar16)->name,IVar10,&module->event_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppEVar16 = ppEVar16 + 1;
      IVar10 = IVar10 + 1;
    } while (ppEVar16 != ppEVar4);
  }
  ppEVar17 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar5 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar17 != ppEVar5) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppEVar17)->name,IVar10,&module->export_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppEVar17 = ppEVar17 + 1;
      IVar10 = IVar10 + 1;
    } while (ppEVar17 != ppEVar5);
  }
  ppTVar18 = (module->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar6 = (module->types).
            super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar18 != ppTVar6) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppTVar18)->name,IVar10,&module->type_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppTVar18 = ppTVar18 + 1;
      IVar10 = IVar10 + 1;
    } while (ppTVar18 != ppTVar6);
  }
  ppMVar19 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppMVar7 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar19 != ppMVar7) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppMVar19)->name,IVar10,&module->memory_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppMVar19 = ppMVar19 + 1;
      IVar10 = IVar10 + 1;
    } while (ppMVar19 != ppMVar7);
  }
  ppDVar20 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar8 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar20 != ppDVar8) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppDVar20)->name,IVar10,&module->data_segment_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppDVar20 = ppDVar20 + 1;
      IVar10 = IVar10 + 1;
    } while (ppDVar20 != ppDVar8);
  }
  ppEVar12 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar9 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar12 != ppEVar9) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppEVar12)->name,IVar10,&module->elem_segment_bindings,
                         (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
                          *)0x0);
      ppEVar12 = ppEVar12 + 1;
      IVar10 = IVar10 + 1;
    } while (ppEVar12 != ppEVar9);
  }
  RenameToContents(&module->data_segments,&module->data_segment_bindings);
  std::
  _Rb_tree<wabt::string_view,_wabt::string_view,_std::_Identity<wabt::string_view>,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void RenameAll(Module& module) {
  // We also filter common C++ keywords/STL idents that make for huge
  // identifiers.
  // FIXME: this can obviously give bad results if the input is not C++..
  std::set<string_view> filter = {
    { "const" },
    { "std" },
    { "allocator" },
    { "char" },
    { "basic" },
    { "traits" },
    { "wchar" },
    { "t" },
    { "void" },
    { "int" },
    { "unsigned" },
    { "2" },
    { "cxxabiv1" },
    { "short" },
    { "4096ul" },
  };
  RenameToIdentifiers(module.funcs, module.func_bindings, &filter);
  // Also do this for some other kinds of names, but without the keyword
  // substitution.
  RenameToIdentifiers(module.globals, module.global_bindings, nullptr);
  RenameToIdentifiers(module.tables, module.table_bindings, nullptr);
  RenameToIdentifiers(module.events, module.event_bindings, nullptr);
  RenameToIdentifiers(module.exports, module.export_bindings, nullptr);
  RenameToIdentifiers(module.types, module.type_bindings, nullptr);
  RenameToIdentifiers(module.memories, module.memory_bindings, nullptr);
  RenameToIdentifiers(module.data_segments, module.data_segment_bindings,
                      nullptr);
  RenameToIdentifiers(module.elem_segments, module.elem_segment_bindings,
                      nullptr);
  // Special purpose naming for data segments.
  RenameToContents(module.data_segments, module.data_segment_bindings);
}